

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.cpp
# Opt level: O0

void Arith(lua_State *L,StkId ra,TValue *rb,TValue *rc,TMS op)

{
  double __y;
  int iVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  double dVar4;
  double dVar5;
  TValue *i_o_6;
  TValue *i_o_5;
  TValue *i_o_4;
  TValue *i_o_3;
  TValue *i_o_2;
  TValue *i_o_1;
  TValue *i_o;
  lua_Number nc;
  lua_Number nb;
  TValue *c;
  TValue *b;
  TValue tempc;
  TValue tempb;
  TMS op_local;
  TValue *rc_local;
  TValue *rb_local;
  StkId ra_local;
  lua_State *L_local;
  
  pTVar2 = luaV_tonumber(rb,(TValue *)&tempc.tt);
  if ((pTVar2 == (TValue *)0x0) ||
     (pTVar3 = luaV_tonumber(rc,(TValue *)&b), pTVar3 == (TValue *)0x0)) {
    iVar1 = call_binTM(L,rb,rc,ra,op);
    if (iVar1 == 0) {
      luaG_aritherror(L,rb,rc);
    }
  }
  else {
    dVar5 = (pTVar2->value).n;
    __y = (pTVar3->value).n;
    switch(op) {
    case TM_ADD:
      (ra->value).n = dVar5 + __y;
      ra->tt = 3;
      break;
    case TM_SUB:
      (ra->value).n = dVar5 - __y;
      ra->tt = 3;
      break;
    case TM_MUL:
      (ra->value).n = dVar5 * __y;
      ra->tt = 3;
      break;
    case TM_DIV:
      (ra->value).n = dVar5 / __y;
      ra->tt = 3;
      break;
    case TM_MOD:
      dVar4 = floor(dVar5 / __y);
      (ra->value).n = -dVar4 * __y + dVar5;
      ra->tt = 3;
      break;
    case TM_POW:
      dVar5 = pow(dVar5,__y);
      (ra->value).n = dVar5;
      ra->tt = 3;
      break;
    case TM_UNM:
      (ra->value).gc = (GCObject *)((ulong)dVar5 ^ 0x8000000000000000);
      ra->tt = 3;
    }
  }
  return;
}

Assistant:

static void Arith (lua_State *L, StkId ra, const TValue *rb,
                   const TValue *rc, TMS op) {
  TValue tempb, tempc;
  const TValue *b, *c;
  if ((b = luaV_tonumber(rb, &tempb)) != NULL &&
      (c = luaV_tonumber(rc, &tempc)) != NULL) {
    lua_Number nb = nvalue(b), nc = nvalue(c);
    switch (op) {
      case TM_ADD: setnvalue(ra, luai_numadd(nb, nc)); break;
      case TM_SUB: setnvalue(ra, luai_numsub(nb, nc)); break;
      case TM_MUL: setnvalue(ra, luai_nummul(nb, nc)); break;
      case TM_DIV: setnvalue(ra, luai_numdiv(nb, nc)); break;
      case TM_MOD: setnvalue(ra, luai_nummod(nb, nc)); break;
      case TM_POW: setnvalue(ra, luai_numpow(nb, nc)); break;
      case TM_UNM: setnvalue(ra, luai_numunm(nb)); break;
      default: lua_assert(0); break;
    }
  }
  else if (!call_binTM(L, rb, rc, ra, op))
    luaG_aritherror(L, rb, rc);
}